

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

Result wabt::ParseFloat(LiteralType literal_type,char *s,char *end,uint32_t *out_bits)

{
  byte bVar1;
  uint uVar2;
  Uint *pUVar3;
  bool bVar4;
  Result RVar5;
  char cVar6;
  byte *pbVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  byte *pbVar13;
  Uint UVar14;
  uint uVar15;
  uint uVar16;
  bool local_59;
  uint local_58;
  uint local_54;
  Uint *local_50;
  undefined8 local_48;
  uint32_t digit;
  uint *local_38;
  
  if (Nan < literal_type) {
    abort();
  }
  switch(literal_type) {
  default:
    RVar5 = anon_unknown_0::FloatParser<float>::ParseFloat(s,end,out_bits);
    return (Result)RVar5.enum_;
  case Hexfloat:
    cVar6 = *s;
    local_48 = CONCAT71((int7)((ulong)((long)&switchD_0016f7d2::switchdataD_001db0a0 +
                                      (long)(int)(&switchD_0016f7d2::switchdataD_001db0a0)
                                                 [literal_type]) >> 8),cVar6);
    local_50 = out_bits;
    bVar4 = anon_unknown_0::FloatParser<float>::StringStartsWith
                      (s + ((cVar6 - 0x2bU & 0xfd) == 0),end,"0x");
    if (!bVar4) {
      __assert_fail("StringStartsWith(s, end, \"0x\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                    ,0x107,
                    "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                   );
    }
    local_54 = 0;
    uVar15 = 0;
    iVar9 = 0;
    bVar4 = false;
    for (pbVar13 = (byte *)(s + ((cVar6 - 0x2bU & 0xfd) == 0) + 2); local_58 = uVar15, pbVar13 < end
        ; pbVar13 = pbVar13 + 1) {
      bVar1 = *pbVar13;
      iVar8 = iVar9;
      if (bVar1 == 0x2e) {
        bVar4 = true;
      }
      else if (bVar1 != 0x5f) {
        RVar5 = ParseHexdigit(bVar1,&digit);
        if (RVar5.enum_ != Ok) {
          local_59 = SUB41(local_54,0);
          if (uVar15 == 0) goto LAB_0016fa5b;
          if ((bVar1 | 0x20) != 0x70) {
            __assert_fail("*s == \'p\' || *s == \'P\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                          ,0x137,
                          "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                         );
          }
          bVar1 = pbVar13[1];
          pbVar7 = pbVar13 + 1;
          iVar8 = 0;
          if (bVar1 == 0x2b) {
            pbVar7 = pbVar13 + 2;
            iVar8 = iVar9;
          }
          iVar11 = 0;
          if (bVar1 == 0x2d) {
            pbVar7 = pbVar13 + 2;
            iVar11 = 0;
            iVar8 = -iVar9;
          }
          goto LAB_0016fa2c;
        }
        if (uVar15 < 0x1000000) {
          uVar15 = uVar15 * 0x10 + digit;
          iVar8 = iVar9 + -4;
          if (!bVar4) {
            iVar8 = iVar9;
          }
        }
        else {
          uVar16 = local_54 & 0xff;
          uVar10 = 1;
          if (digit == 0) {
            uVar10 = uVar16;
          }
          uVar2 = local_54 & 1;
          local_54 = uVar10;
          if (uVar2 != 0) {
            local_54 = uVar16;
          }
          iVar8 = iVar9 + 4;
          if (bVar4) {
            iVar8 = iVar9;
          }
        }
      }
      iVar9 = iVar8;
    }
    local_59 = SUB41(local_54,0);
    iVar8 = 0;
    if (uVar15 == 0) {
LAB_0016fa5b:
      *local_50 = (uint)((char)local_48 == '-') << 0x1f;
      return (Result)Ok;
    }
    goto LAB_0016fa7f;
  case Infinity:
    cVar6 = *s;
    bVar4 = anon_unknown_0::FloatParser<float>::StringStartsWith
                      (s + ((cVar6 - 0x2bU & 0xfd) == 0),end,"inf");
    if (!bVar4) {
      __assert_fail("StringStartsWith(s, end, \"inf\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                    ,0x1a4,
                    "static void wabt::(anonymous namespace)::FloatParser<float>::ParseInfinity(const char *, const char *, Uint *) [T = float]"
                   );
    }
    UVar14 = (uint)(cVar6 != '-') * -0x80000000 - 0x800000;
    break;
  case Nan:
    cVar6 = *s;
    pcVar12 = s + ((cVar6 - 0x2bU & 0xfd) == 0);
    bVar4 = anon_unknown_0::FloatParser<float>::StringStartsWith(pcVar12,end,"nan");
    if (!bVar4) {
      __assert_fail("StringStartsWith(s, end, \"nan\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                    ,0xd9,
                    "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseNan(const char *, const char *, Uint *) [T = float]"
                   );
    }
    if (pcVar12 + 3 == end) {
      UVar14 = 0x400000;
    }
    else {
      bVar4 = anon_unknown_0::FloatParser<float>::StringStartsWith(pcVar12 + 3,end,":0x");
      if (!bVar4) {
        __assert_fail("StringStartsWith(s, end, \":0x\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                      ,0xdf,
                      "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseNan(const char *, const char *, Uint *) [T = float]"
                     );
      }
      UVar14 = 0;
      for (pcVar12 = pcVar12 + 6; pcVar12 < end; pcVar12 = pcVar12 + 1) {
        if (*pcVar12 != '_') {
          RVar5 = ParseHexdigit(*pcVar12,&digit);
          if (RVar5.enum_ == Error) {
            return (Result)Error;
          }
          UVar14 = UVar14 * 0x10 + digit;
          if (0x7fffff < UVar14) {
            return (Result)Error;
          }
        }
      }
      if (UVar14 == 0) {
        return (Result)Error;
      }
    }
    UVar14 = anon_unknown_0::FloatParser<float>::Make(cVar6 == '-',0x80,UVar14);
  }
  *out_bits = UVar14;
  return (Result)Ok;
LAB_0016fa2c:
  if (end <= pbVar7) goto LAB_0016fa76;
  if ((char)*pbVar7 != 0x5f) {
    uVar10 = (int)(char)*pbVar7 - 0x30;
    if (9 < uVar10) {
      __assert_fail("digit <= 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                    ,0x14c,
                    "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                   );
    }
    iVar11 = uVar10 + iVar11 * 10;
    if (0x7f < iVar11 + iVar8) goto LAB_0016fa76;
  }
  pbVar7 = pbVar7 + 1;
  goto LAB_0016fa2c;
LAB_0016fa76:
  iVar8 = -iVar11;
  if (bVar1 != 0x2d) {
    iVar8 = iVar11;
  }
LAB_0016fa7f:
  uVar10 = 0x1f;
  if (uVar15 != 0) {
    for (; uVar15 >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  uVar10 = uVar10 ^ 0x1f;
  iVar11 = iVar8 + (iVar9 - uVar10);
  uVar16 = iVar8 + (iVar9 - uVar10) + 0x1f;
  cVar6 = (char)uVar10;
  if ((int)uVar16 < -0x7e) {
    _digit = &local_59;
    local_38 = &local_58;
    if (uVar15 < 0x800000) {
      if (uVar10 != 9) {
        uVar15 = uVar15 << (cVar6 - 9U & 0x1f);
      }
    }
    else {
      anon_unknown_0::FloatParser<float>::ParseHex::anon_class_16_2_81164835::operator()
                ((anon_class_16_2_81164835 *)&digit,9 - uVar10);
      uVar15 = local_58 >> ((byte)(9 - uVar10) & 0x1f);
    }
    if (0xffffff69 < uVar16) {
      local_58 = uVar15;
      if (uVar16 != 0xffffff81) {
        uVar15 = -iVar11 - 0x9e;
        anon_unknown_0::FloatParser<float>::ParseHex::anon_class_16_2_81164835::operator()
                  ((anon_class_16_2_81164835 *)&digit,uVar15);
        iVar8 = 1 << (0x61U - (char)iVar11 & 0x1f);
        iVar9 = 0;
        if (local_59 != false) {
          iVar9 = iVar8;
        }
        if ((local_58 >> (uVar15 & 0x1f) & 1) != 0) {
          iVar9 = iVar8;
        }
        local_58 = iVar9 + local_58 >> ((byte)uVar15 & 0x1f) & 0x7fffff;
      }
      if (local_58 != 0) {
        uVar16 = 0xffffff81;
        uVar15 = local_58;
        goto LAB_0016fbeb;
      }
    }
    UVar14 = (uint)((char)local_48 == '-') << 0x1f;
  }
  else {
    if (uVar15 < 0x1000000) {
      if (uVar10 != 8) {
        uVar15 = uVar15 << (cVar6 - 8U & 0x1f);
      }
    }
    else {
      iVar8 = 1 << (7U - cVar6 & 0x1f);
      iVar9 = 0;
      if ((local_54 & 1) != 0) {
        iVar9 = iVar8;
      }
      if ((uVar15 >> ((byte)(8U - cVar6) & 0x1f) & 1) != 0) {
        iVar9 = iVar8;
      }
      uVar15 = iVar9 + uVar15 >> (8U - cVar6 & 0x1f);
      if (0xffffff < uVar15) {
        uVar16 = iVar11 + 0x20;
      }
    }
    if (0x7f < (int)uVar16) {
      return (Result)Error;
    }
    uVar15 = uVar15 & 0x7fffff;
LAB_0016fbeb:
    pUVar3 = local_50;
    UVar14 = anon_unknown_0::FloatParser<float>::Make((char)local_48 == '-',uVar16,uVar15);
    local_50 = pUVar3;
  }
  *local_50 = UVar14;
  return (Result)Ok;
}

Assistant:

Result FloatParser<T>::Parse(LiteralType literal_type,
                             const char* s,
                             const char* end,
                             Uint* out_bits) {
#if COMPILER_IS_MSVC
  if (literal_type == LiteralType::Int && StringStartsWith(s, end, "0x")) {
    // Some MSVC crt implementation of strtof doesn't support hex strings
    literal_type = LiteralType::Hexfloat;
  }
#endif
  switch (literal_type) {
    case LiteralType::Int:
    case LiteralType::Float:
      return ParseFloat(s, end, out_bits);

    case LiteralType::Hexfloat:
      return ParseHex(s, end, out_bits);

    case LiteralType::Infinity:
      ParseInfinity(s, end, out_bits);
      return Result::Ok;

    case LiteralType::Nan:
      return ParseNan(s, end, out_bits);
  }

  WABT_UNREACHABLE;
}